

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O2

void __thiscall
cppjit::kernel<void,_cppjit::detail::pack<>_>::operator()
          (kernel<void,_cppjit::detail::pack<>_> *this)

{
  if ((this->kernel_implementation).super__Function_base._M_manager == (_Manager_type)0x0) {
    compile(this);
  }
  std::function<void_()>::operator()(&this->kernel_implementation);
  return;
}

Assistant:

R operator()(Args... args) {
    if (!kernel_implementation) {
      this->compile();
      // throw cppjit::cppjit_exception("kernel not compiled");
    }
    return kernel_implementation(std::forward<Args>(args)...);
  }